

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*>::relocate
          (QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *this,
          qsizetype offset,WindowSystemEvent ***data)

{
  WindowSystemEvent **d_first;
  WindowSystemEvent **ppWVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QWindowSystemInterfacePrivate::WindowSystemEvent*,long_long>
            (this->ptr,this->size,d_first);
  if (data != (WindowSystemEvent ***)0x0) {
    ppWVar1 = *data;
    if ((this->ptr <= ppWVar1) && (ppWVar1 < this->ptr + this->size)) {
      *data = ppWVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }